

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

int VP8LColorSpaceTransform
              (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image,
              WebPPicture *pic,int percent_range,int *percent,int *best_bits)

{
  int *piVar1;
  long lVar2;
  VP8LMultipliers VVar3;
  int iVar4;
  undefined5 extraout_var;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint32_t *puVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  undefined4 in_register_00000034;
  long lVar12;
  ulong uVar13;
  VP8LMultipliers local_904;
  uint local_900;
  uint local_8fc;
  uint local_8f8;
  uint local_8f4;
  int local_8f0;
  undefined4 local_8ec;
  int local_8e8;
  undefined4 local_8e4;
  undefined8 local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  uint local_8c8;
  int local_8c4;
  uint local_8c0;
  int local_8bc;
  long local_8b8;
  ulong local_8b0;
  ulong local_8a8;
  ulong local_8a0;
  ulong local_898;
  uint32_t *local_890;
  ulong local_888;
  ulong local_880;
  long local_878;
  uint32_t *local_870;
  long local_868;
  uint32_t *local_860;
  ulong local_858;
  long local_850;
  ulong local_848;
  ulong local_840;
  uint32_t accumulated_blue_histo [256];
  uint32_t accumulated_red_histo [256];
  
  local_8e0 = CONCAT44(in_register_00000034,height);
  bVar5 = (byte)bits;
  uVar6 = 1 << (bVar5 & 0x1f);
  local_8d8 = (ulong)uVar6;
  uVar6 = (uVar6 + height) - 1;
  uVar10 = uVar6 >> (bVar5 & 0x1f);
  local_880 = (ulong)(uint)*percent;
  local_8f0 = quality;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  uVar13 = (ulong)(uint)width;
  local_900 = uVar10;
  if (0 < (int)(uVar6 >> (bVar5 & 0x1f))) {
    uVar6 = (uint)((int)local_8d8 + -1 + width) >> (bVar5 & 0x1f);
    local_8a8 = (ulong)uVar6;
    local_878 = (long)(width + 2);
    local_8b8 = (long)(int)uVar6;
    local_888 = (ulong)uVar10;
    local_868 = (long)width * 4;
    local_870 = argb + -(long)width;
    uVar9 = 0;
    local_8f4 = 0;
    local_8f8 = 0;
    local_8fc = 0;
    local_8e4 = 0;
    local_8e8 = 0;
    local_8ec = 0;
    local_8c4 = bits;
    local_8b0 = (ulong)(uint)width;
    local_890 = argb;
    local_860 = image;
    do {
      if (0 < (int)local_8a8) {
        uVar10 = (int)uVar9 << ((byte)bits & 0x1f);
        local_898 = (ulong)uVar10;
        local_8c0 = uVar10 + (int)local_8d8;
        uVar6 = (uint)local_8e0;
        if ((int)uVar6 <= (int)local_8c0) {
          local_8c0 = uVar6;
        }
        local_850 = uVar9 * local_8b8;
        local_858 = (ulong)(uVar6 - uVar10);
        if ((int)local_8d8 < (int)(uVar6 - uVar10)) {
          local_858 = local_8d8 & 0xffffffff;
        }
        local_8a0 = (ulong)(uVar10 * (int)local_8b0);
        local_8c8 = (int)local_858 + 1;
        uVar13 = 0;
        local_848 = uVar9;
        do {
          uVar6 = (int)uVar13 << ((byte)bits & 0x1f);
          local_8d0 = (ulong)uVar6;
          local_8bc = (int)local_8d8 + uVar6;
          iVar4 = (int)local_8b0;
          if (iVar4 <= local_8bc) {
            local_8bc = iVar4;
          }
          lVar12 = uVar13 + local_850;
          if (local_848 == 0) {
            uVar6 = local_8f4 & 0xff | (local_8f8 & 0xff) << 8 | (local_8fc & 0xff) << 0x10;
            iVar7 = 0;
          }
          else {
            uVar6 = image[lVar12 - local_8b8];
            local_8f8 = uVar6 >> 8;
            local_8fc = uVar6 >> 0x10;
            iVar7 = (int)local_848;
            local_8f4 = uVar6;
          }
          VVar3.red_to_blue_ = (undefined1)local_8ec;
          VVar3.green_to_blue_ = (undefined1)local_8e8;
          VVar3.green_to_red_ = (uint8_t)local_8e4;
          local_840 = uVar13;
          VVar3 = GetBestColorTransformForTile
                            ((int)uVar13,iVar7,bits,VVar3,SUB43(uVar6,0),local_8f0,iVar4,
                             (int)local_8e0,accumulated_red_histo,accumulated_blue_histo,argb);
          lVar2 = local_868;
          local_8e4 = (undefined4)CONCAT53(extraout_var,VVar3);
          uVar13 = CONCAT53(extraout_var,VVar3) >> 8 & 0xffffff;
          local_8e8 = (int)uVar13;
          uVar6 = (uint)VVar3.green_to_red_ | local_8e8 << 8;
          iVar7 = iVar4 - (int)local_8d0;
          if ((int)local_8d8 < iVar4 - (int)local_8d0) {
            iVar7 = (int)local_8d8;
          }
          image[lVar12] = uVar6 | 0xff000000;
          local_8ec = (undefined4)(uVar13 >> 8);
          local_904.red_to_blue_ = (uint8_t)(uVar13 >> 8);
          local_904._0_2_ = SUB42(uVar6,0);
          if (0 < (int)local_858) {
            puVar8 = local_890 + ((int)local_8a0 + (int)local_8d0);
            uVar6 = local_8c8;
            do {
              (*VP8LTransformColor)(&local_904,puVar8,iVar7);
              uVar6 = uVar6 - 1;
              puVar8 = (uint32_t *)((long)puVar8 + lVar2);
            } while (1 < uVar6);
          }
          if ((int)local_898 < (int)local_8c0) {
            iVar7 = (int)local_8d0;
            iVar4 = (int)local_8a0 + iVar7;
            uVar13 = local_898;
            do {
              iVar11 = (int)uVar13 * (int)local_8b0;
              if (iVar11 + iVar7 < iVar11 + local_8bc) {
                lVar12 = (long)iVar4;
                iVar11 = local_8bc - iVar7;
                do {
                  uVar6 = local_890[lVar12];
                  if ((((lVar12 < 2) || (uVar6 != local_890[lVar12 + -2])) ||
                      (uVar6 != local_890[lVar12 + -1])) &&
                     (((lVar12 < local_878 || (local_890[lVar12 + -2] != local_870[lVar12 + -2])) ||
                      ((local_890[lVar12 + -1] != local_870[lVar12 + -1] ||
                       (uVar6 != local_870[lVar12])))))) {
                    piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar6 >> 0xe & 0x3fc));
                    *piVar1 = *piVar1 + 1;
                    accumulated_blue_histo[uVar6 & 0xff] = accumulated_blue_histo[uVar6 & 0xff] + 1;
                  }
                  lVar12 = lVar12 + 1;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
              }
              uVar6 = (int)uVar13 + 1;
              uVar13 = (ulong)uVar6;
              iVar4 = iVar4 + (int)local_8b0;
            } while (uVar6 != local_8c0);
          }
          uVar13 = local_840 + 1;
          uVar9 = local_848;
          image = local_860;
          argb = local_890;
          bits = local_8c4;
        } while (uVar13 != local_8a8);
      }
      iVar4 = WebPReportProgress(pic,((int)uVar9 * percent_range) / (int)local_900 + (int)local_880,
                                 percent);
      if (iVar4 == 0) {
        return 0;
      }
      uVar9 = uVar9 + 1;
      uVar13 = local_8b0;
    } while (uVar9 != local_888);
  }
  VP8LOptimizeSampling(image,(int)uVar13,(int)local_8e0,bits,9,best_bits);
  return 1;
}

Assistant:

int VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                            uint32_t* const argb, uint32_t* image,
                            const WebPPicture* const pic, int percent_range,
                            int* const percent, int* const best_bits) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int percent_start = *percent;
  uint32_t accumulated_red_histo[256] = { 0 };
  uint32_t accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
    if (!WebPReportProgress(
            pic, percent_start + percent_range * tile_y / tile_ysize,
            percent)) {
      return 0;
    }
  }
  VP8LOptimizeSampling(image, width, height, bits, MAX_TRANSFORM_BITS,
                       best_bits);
  return 1;
}